

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

common_control_vector_data *
common_control_vector_load
          (common_control_vector_data *__return_storage_ptr__,
          vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
          *load_infos)

{
  pointer pfVar1;
  pointer pfVar2;
  common_control_vector_data *pcVar3;
  uint uVar4;
  int iVar5;
  common_log *pcVar6;
  char *pcVar7;
  int *piVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  pointer pcVar14;
  int iVar15;
  common_control_vector_data cur;
  ggml_context *ctx;
  string name;
  int local_d0;
  vector<float,_std::allocator<float>_> local_c8;
  common_control_vector_data *local_b0;
  vector<float,_std::allocator<float>_> *local_a8;
  long local_a0;
  undefined8 local_98;
  value_type_conflict6 local_90;
  undefined4 uStack_8c;
  long local_80 [2];
  value_type_conflict6 local_70;
  undefined4 uStack_6c;
  long local_60 [2];
  ulong local_50;
  pointer local_48;
  ulong local_40;
  char *local_38;
  
  __return_storage_ptr__->n_embd = -1;
  local_a8 = &__return_storage_ptr__->data;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar14 = (load_infos->
            super__Vector_base<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_48 = (load_infos->
             super__Vector_base<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_b0 = __return_storage_ptr__;
  if (pcVar14 != local_48) {
    do {
      local_d0 = -1;
      local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_98 = 0;
      local_a0 = gguf_init_from_file((pcVar14->fname)._M_dataplus._M_p,0,&local_98);
      if (local_a0 == 0) {
        if (-1 < common_log_verbosity_thold) {
          pcVar6 = common_log_main();
          common_log_add(pcVar6,GGML_LOG_LEVEL_ERROR,
                         "%s: failed to load control vector file from %s\n",
                         "common_control_vector_load_one",(pcVar14->fname)._M_dataplus._M_p);
        }
      }
      else {
        uVar4 = gguf_get_n_tensors();
        if ((uVar4 == 0) && (-1 < common_log_verbosity_thold)) {
          pcVar6 = common_log_main();
          common_log_add(pcVar6,GGML_LOG_LEVEL_WARN,"%s: no direction tensors found in %s\n",
                         "common_control_vector_load_one",(pcVar14->fname)._M_dataplus._M_p);
        }
        else if (0 < (int)uVar4) {
          local_50 = (ulong)(uVar4 & 0x7fffffff);
          uVar13 = 0;
          do {
            local_40 = uVar13;
            pcVar7 = (char *)gguf_get_tensor_name(local_a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,pcVar7,(allocator<char> *)&local_90);
            lVar11 = std::__cxx11::string::find((char)(string *)&local_70,0x2e);
            if (lVar11 == -1) {
LAB_001f71b0:
              if (-1 < common_log_verbosity_thold) {
                pcVar6 = common_log_main();
                pcVar7 = "%s: invalid/unparsable direction tensor layer index in %s\n";
LAB_001f71c8:
                common_log_add(pcVar6,GGML_LOG_LEVEL_ERROR,pcVar7,"common_control_vector_load_one",
                               (pcVar14->fname)._M_dataplus._M_p);
              }
LAB_001f71e3:
              local_d0 = -1;
              if ((long *)CONCAT44(uStack_6c,local_70) != local_60) {
                operator_delete((long *)CONCAT44(uStack_6c,local_70),local_60[0] + 1);
              }
              break;
            }
            std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
            iVar5 = std::__cxx11::string::compare((char *)&local_90);
            if ((long *)CONCAT44(uStack_8c,local_90) != local_80) {
              operator_delete((long *)CONCAT44(uStack_8c,local_90),local_80[0] + 1);
            }
            if (iVar5 != 0) goto LAB_001f71b0;
            std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
            pcVar7 = (char *)CONCAT44(uStack_8c,local_90);
            piVar8 = __errno_location();
            iVar5 = *piVar8;
            *piVar8 = 0;
            lVar11 = strtol(pcVar7,&local_38,10);
            if (local_38 == pcVar7) {
              uVar9 = std::__throw_invalid_argument("stoi");
LAB_001f7429:
              if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_c8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              pfVar1 = (local_a8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if (pfVar1 != (pointer)0x0) {
                operator_delete(pfVar1,(long)(local_b0->data).
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage -
                                       (long)pfVar1);
              }
              _Unwind_Resume(uVar9);
            }
            iVar15 = (int)lVar11;
            if ((iVar15 != lVar11) || (*piVar8 == 0x22)) {
              uVar9 = std::__throw_out_of_range("stoi");
              goto LAB_001f7429;
            }
            if (*piVar8 == 0) {
              *piVar8 = iVar5;
            }
            if ((long *)CONCAT44(uStack_8c,local_90) != local_80) {
              operator_delete((long *)CONCAT44(uStack_8c,local_90),local_80[0] + 1);
            }
            if (iVar15 < 0) goto LAB_001f71b0;
            if (iVar15 == 0) {
              if (common_log_verbosity_thold < 0) goto LAB_001f71e3;
              pcVar6 = common_log_main();
              pcVar7 = "%s: invalid (zero) direction tensor layer index in %s\n";
              goto LAB_001f71c8;
            }
            piVar8 = (int *)ggml_get_tensor(local_98,CONCAT44(uStack_6c,local_70));
            if (*piVar8 != 0) {
              if (-1 < common_log_verbosity_thold) {
                pcVar6 = common_log_main();
                pcVar7 = "%s: invalid (non-F32) direction tensor type in %s\n";
LAB_001f712b:
                common_log_add(pcVar6,GGML_LOG_LEVEL_ERROR,pcVar7,"common_control_vector_load_one",
                               (pcVar14->fname)._M_dataplus._M_p);
              }
              goto LAB_001f71e3;
            }
            iVar5 = ggml_n_dims(piVar8);
            if (iVar5 != 1) {
              if (-1 < common_log_verbosity_thold) {
                pcVar6 = common_log_main();
                pcVar7 = "%s: invalid (non-1D) direction tensor shape in %s\n";
                goto LAB_001f712b;
              }
              goto LAB_001f71e3;
            }
            if (local_d0 == -1) {
              local_d0 = ggml_nelements(piVar8);
            }
            else {
              lVar11 = ggml_nelements(piVar8);
              if (lVar11 != local_d0) {
                if (-1 < common_log_verbosity_thold) {
                  pcVar6 = common_log_main();
                  pcVar7 = "%s: direction tensor in %s does not match previous dimensions\n";
                  goto LAB_001f712b;
                }
                goto LAB_001f71e3;
              }
            }
            uVar13 = (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            if (uVar13 <= (ulong)(long)(local_d0 * iVar15)) {
              uVar13 = (long)(local_d0 * iVar15);
            }
            local_90 = 0.0;
            std::vector<float,_std::allocator<float>_>::resize(&local_c8,uVar13,&local_90);
            if (0 < (long)local_d0) {
              lVar11 = *(long *)(piVar8 + 0x3e);
              iVar5 = (iVar15 + -1) * local_d0;
              lVar12 = 0;
              do {
                local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[iVar5 + lVar12] =
                     *(float *)(lVar11 + lVar12 * 4) * pcVar14->strength +
                     local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar5 + lVar12];
                lVar12 = lVar12 + 1;
              } while (local_d0 != lVar12);
            }
            if ((long *)CONCAT44(uStack_6c,local_70) != local_60) {
              operator_delete((long *)CONCAT44(uStack_6c,local_70),local_60[0] + 1);
            }
            uVar13 = local_40 + 1;
          } while (uVar13 != local_50);
        }
        if (local_d0 == -1) {
          if (-1 < common_log_verbosity_thold) {
            pcVar6 = common_log_main();
            common_log_add(pcVar6,GGML_LOG_LEVEL_WARN,
                           "%s: skipping %s due to invalid direction tensors\n",
                           "common_control_vector_load_one",(pcVar14->fname)._M_dataplus._M_p);
          }
          if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
        }
        gguf_free(local_a0);
        ggml_free(local_98);
      }
      if (local_d0 == -1) {
LAB_001f73ac:
        local_b0->n_embd = -1;
        if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        break;
      }
      iVar5 = local_b0->n_embd;
      if (iVar5 != local_d0 && iVar5 != -1) {
        if (-1 < common_log_verbosity_thold) {
          pcVar6 = common_log_main();
          common_log_add(pcVar6,GGML_LOG_LEVEL_ERROR,
                         "%s: control vectors in %s does not match previous dimensions\n",
                         "common_control_vector_load",(pcVar14->fname)._M_dataplus._M_p);
        }
        goto LAB_001f73ac;
      }
      if (iVar5 == -1) {
        local_b0->n_embd = local_d0;
        pfVar1 = (local_b0->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2 = (local_b0->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (local_b0->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_b0->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (local_b0->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        if (pfVar1 != (pointer)0x0) {
          operator_delete(pfVar1,(long)pfVar2 - (long)pfVar1);
          goto LAB_001f7353;
        }
      }
      else {
        uVar10 = (long)(local_b0->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(local_b0->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        uVar13 = (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        if (uVar13 < uVar10) {
          uVar13 = uVar10;
        }
        local_70 = 0.0;
        std::vector<float,_std::allocator<float>_>::resize(local_a8,uVar13,&local_70);
        if ((long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar11 = (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          pfVar1 = (local_a8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar12 = 0;
          do {
            pfVar1[lVar12] =
                 local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12] + pfVar1[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
        }
LAB_001f7353:
        if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      pcVar14 = pcVar14 + 1;
    } while (pcVar14 != local_48);
  }
  pcVar3 = local_b0;
  if (local_b0->n_embd == -1) {
    if (-1 < common_log_verbosity_thold) {
      pcVar6 = common_log_main();
      common_log_add(pcVar6,GGML_LOG_LEVEL_ERROR,"%s: no valid control vector files passed\n",
                     "common_control_vector_load");
    }
    pfVar1 = (pcVar3->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pcVar3->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (pcVar3->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
  }
  return pcVar3;
}

Assistant:

common_control_vector_data common_control_vector_load(const std::vector<common_control_vector_load_info> & load_infos) {
    common_control_vector_data result = { -1, {} };

    for (const auto & info : load_infos) {
        auto cur = common_control_vector_load_one(info);

        if (cur.n_embd == -1) {
            result.n_embd = -1;
            break;
        }
        if (result.n_embd != -1 && result.n_embd != cur.n_embd) {
            LOG_ERR("%s: control vectors in %s does not match previous dimensions\n", __func__, info.fname.c_str());
            result.n_embd = -1;
            break;
        }

        if (result.n_embd == -1) {
            result = std::move(cur);
        } else {
            result.data.resize(std::max(result.data.size(), cur.data.size()), 0.0f);  // extend if necessary
            for (size_t i = 0; i < cur.data.size(); i++) {
                result.data[i] += cur.data[i];
            }
        }
    }

    if (result.n_embd == -1) {
        LOG_ERR("%s: no valid control vector files passed\n", __func__);
        result.data.clear();
    }

    return result;
}